

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_strategy.c
# Opt level: O0

void write_motion_feature_to_file
               (char *path,int sb_counter,uint *block_sse,uint *block_var,int num_blocks,
               BLOCK_SIZE bsize,BLOCK_SIZE fixed_block_size,int mi_row,int mi_col)

{
  FILE *__stream;
  long in_RCX;
  long in_RDX;
  uint in_ESI;
  undefined8 in_RDI;
  int in_R8D;
  byte in_R9B;
  byte in_stack_00000008;
  int i_1;
  int i;
  FILE *pfile;
  char filename [256];
  int local_138;
  int local_134;
  char local_128 [259];
  byte local_25;
  int local_24;
  long local_20;
  long local_18;
  
  local_25 = in_R9B;
  local_24 = in_R8D;
  local_20 = in_RCX;
  local_18 = in_RDX;
  snprintf(local_128,0x100,"%s/motion_search_feature_sb%d",in_RDI,(ulong)in_ESI,
           (ulong)CONCAT31((int3)((uint)i_1 >> 8),in_stack_00000008));
  __stream = fopen64(local_128,"w");
  fprintf(__stream,"%d,%d,%d,%d,%d\n",(ulong)(uint)i_1,(ulong)(uint)pfile,(ulong)local_25,
          (ulong)block_size_wide[in_stack_00000008],local_24);
  for (local_134 = 0; local_134 < local_24; local_134 = local_134 + 1) {
    fprintf(__stream,"%d",(ulong)*(uint *)(local_18 + (long)local_134 * 4));
    if (local_134 < local_24 + -1) {
      fprintf(__stream,",");
    }
  }
  fprintf(__stream,"\n");
  for (local_138 = 0; local_138 < local_24; local_138 = local_138 + 1) {
    fprintf(__stream,"%d",(ulong)*(uint *)(local_20 + (long)local_138 * 4));
    if (local_138 < local_24 + -1) {
      fprintf(__stream,",");
    }
  }
  fprintf(__stream,"\n");
  fclose(__stream);
  return;
}

Assistant:

static void write_motion_feature_to_file(
    const char *const path, const int sb_counter, const unsigned int *block_sse,
    const unsigned int *block_var, const int num_blocks, const BLOCK_SIZE bsize,
    const BLOCK_SIZE fixed_block_size, const int mi_row, const int mi_col) {
  char filename[256];
  snprintf(filename, sizeof(filename), "%s/motion_search_feature_sb%d", path,
           sb_counter);
  FILE *pfile = fopen(filename, "w");
  fprintf(pfile, "%d,%d,%d,%d,%d\n", mi_row, mi_col, bsize,
          block_size_wide[fixed_block_size], num_blocks);
  for (int i = 0; i < num_blocks; ++i) {
    fprintf(pfile, "%d", block_sse[i]);
    if (i < num_blocks - 1) fprintf(pfile, ",");
  }
  fprintf(pfile, "\n");
  for (int i = 0; i < num_blocks; ++i) {
    fprintf(pfile, "%d", block_var[i]);
    if (i < num_blocks - 1) fprintf(pfile, ",");
  }
  fprintf(pfile, "\n");
  fclose(pfile);
}